

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::autoRescalePartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,short *scaleFactors)

{
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [64];
  int expMax;
  int local_44;
  long local_40;
  short *local_38;
  
  if (0 < this->kPatternCount) {
    lVar5 = 0;
    local_38 = scaleFactors;
    do {
      iVar1 = this->kPartialsPaddedStateCount;
      if (this->kCategoryCount < 1) {
        dVar8 = 0.0;
      }
      else {
        iVar4 = iVar1 * (int)lVar5;
        auVar9 = ZEXT864(0);
        iVar6 = 0;
        do {
          if (0 < this->kStateCount) {
            lVar7 = 0;
            do {
              auVar2 = vmaxss_avx(ZEXT416((uint)destP[iVar4 + lVar7]),auVar9._0_16_);
              auVar9 = ZEXT1664(auVar2);
              lVar7 = lVar7 + 1;
            } while (this->kStateCount != (int)lVar7);
          }
          iVar6 = iVar6 + 1;
          iVar4 = iVar4 + this->kPaddedPatternCount * iVar1;
        } while (iVar6 != this->kCategoryCount);
        dVar8 = (double)auVar9._0_4_;
      }
      frexp(dVar8,&local_44);
      local_38[lVar5] = (short)local_44;
      local_40 = lVar5;
      if ((local_44 != 0) && (0 < this->kCategoryCount)) {
        iVar6 = -local_44;
        iVar4 = 0;
        do {
          if (0 < this->kStateCount) {
            iVar3 = this->kPaddedPatternCount * this->kPartialsPaddedStateCount * iVar4 +
                    iVar1 * (int)lVar5;
            lVar7 = 0;
            do {
              dVar8 = ldexp(1.0,iVar6);
              destP[iVar3 + lVar7] = (float)(dVar8 * (double)destP[iVar3 + lVar7]);
              lVar7 = lVar7 + 1;
            } while ((int)lVar7 < this->kStateCount);
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < this->kCategoryCount);
      }
      lVar5 = local_40 + 1;
    } while (lVar5 < this->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::autoRescalePartials(REALTYPE* destP,
                                              signed short* scaleFactors) {


    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        int expMax;
        frexp(max, &expMax);
        scaleFactors[k] = expMax;

        if (expMax != 0) {
            for (int l = 0; l < kCategoryCount; l++) {
                int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
                for (int i = 0; i < kStateCount; i++)
                    destP[offset++] *= pow(2.0, -expMax);
            }
        }
    }
}